

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Block<Eigen::Matrix<double,_1,3,1,_1,3>,1,3,true>,Eigen::Matrix<double,1,3,1,1,3>,Eigen::internal::assign_op<double,double>>
               (Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true> *dst,
               Matrix<double,_1,_3,_1,_1,_3> *src,assign_op<double,_double> *func)

{
  undefined8 func_00;
  Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true> *dstExpr;
  undefined1 local_70 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  undefined1 local_30 [8];
  SrcEvaluatorType srcEvaluator;
  assign_op<double,_double> *func_local;
  Matrix<double,_1,_3,_1,_1,_3> *src_local;
  Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true> *dst_local;
  
  srcEvaluator.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>._8_8_
       = func;
  evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::evaluator
            ((evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_30,src);
  resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,3,1,_1,3>,1,3,true>,Eigen::Matrix<double,1,3,1,1,3>,double,double>
            (dst,src,(assign_op<double,_double> *)
                     srcEvaluator.
                     super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     ._8_8_);
  evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_1,_3,_true>_>::evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true>_> *)
             &kernel.m_dstExpr,dst);
  func_00 = srcEvaluator.
            super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>._8_8_;
  dstExpr = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_1,_3,_true>_>::
            const_cast_derived((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true>_>
                                *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_1,_3,_true>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
              *)local_70,(DstEvaluatorType *)&kernel.m_dstExpr,(SrcEvaluatorType *)local_30,
             (assign_op<double,_double> *)func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_1,_3,_true>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_2>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true>_>,_Eigen::internal::evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)local_70);
  evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_1,_3,_true>_>::~evaluator
            ((evaluator<Eigen::Block<Eigen::Matrix<double,__1,_3,_1,__1,_3>,_1,_3,_true>_> *)
             &kernel.m_dstExpr);
  evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::~evaluator
            ((evaluator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)local_30);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}